

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMethods.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::builtins::StringUpperLowerMethod::eval
          (StringUpperLowerMethod *this,EvalContext *context,Args *args,SourceRange param_4,
          SystemCallInfo *param_5)

{
  bool bVar1;
  string *this_00;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_RCX;
  long in_RSI;
  Expression *in_RDI;
  string *str;
  ConstantValue val;
  ConstantValue *in_stack_ffffffffffffff58;
  EvalContext *in_stack_ffffffffffffff60;
  Expression *this_01;
  string *str_00;
  string local_58 [2];
  
  this_01 = in_RDI;
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RCX,0);
  str_00 = local_58;
  Expression::eval(this_01,in_stack_ffffffffffffff60);
  bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0x97ec78);
  if (bVar1) {
    this_00 = slang::ConstantValue::str_abi_cxx11_((ConstantValue *)0x97ecc6);
    if ((*(byte *)(in_RSI + 0x62) & 1) == 0) {
      strToLower(str_00);
    }
    else {
      strToUpper(str_00);
    }
    slang::ConstantValue::ConstantValue((ConstantValue *)this_00,in_stack_ffffffffffffff58);
  }
  else {
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  }
  slang::ConstantValue::~ConstantValue((ConstantValue *)0x97ed1f);
  return (ConstantValue *)in_RDI;
}

Assistant:

ConstantValue eval(EvalContext& context, const Args& args, SourceRange,
                       const CallExpression::SystemCallInfo&) const final {
        auto val = args[0]->eval(context);
        if (!val)
            return nullptr;

        std::string& str = val.str();
        if (upper)
            strToUpper(str);
        else
            strToLower(str);
        return val;
    }